

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

MPP_RET mpp_av1_read_unit(AV1Context *ctx,Av1ObuUnit *unit)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  int nb_bits_00;
  MPP_RET MVar3;
  RK_S32 nb_bits;
  RK_U32 cur_pos;
  AV1RawSequenceHeader *sequence_header;
  RK_S32 in_spatial_layer;
  RK_S32 in_temporal_layer;
  RK_U64 obu_size;
  RK_S32 hdr_start_pos;
  RK_S32 end_pos;
  RK_S32 start_pos;
  RK_S32 err;
  BitReadCtx_t gbc;
  AV1RawOBU *obu;
  Av1ObuUnit *unit_local;
  AV1Context *ctx_local;
  
  end_pos = 0;
  end_pos = mpp_av1_alloc_unit_content(unit);
  if (end_pos < MPP_OK) {
    return end_pos;
  }
  gbc.update_curbyte = (_func_MPP_RET_bitread_ctx_t_ptr *)unit->content;
  mpp_set_bitread_ctx((BitReadCtx_t *)&start_pos,unit->data,(RK_S32)unit->data_size);
  obu_size._0_4_ = mpp_get_bits_count((BitReadCtx_t *)&start_pos);
  end_pos = mpp_av1_read_obu_header
                      (ctx,(BitReadCtx_t *)&start_pos,(AV1RawOBUHeader *)gbc.update_curbyte);
  if (end_pos < MPP_OK) {
    return end_pos;
  }
  if (((uint)(byte)gbc.update_curbyte[1] != unit->type) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "obu->header.obu_type == unit->type","mpp_av1_read_unit",0xb19),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (gbc.update_curbyte[3] == (_func_MPP_RET_bitread_ctx_t_ptr)0x0) {
    if (unit->data_size < (ulong)((byte)gbc.update_curbyte[2] + 1)) {
      _mpp_log_l(2,"av1d_cbs","Invalid OBU length: unit too short (%d).\n",(char *)0x0,
                 unit->data_size);
      return MPP_NOK;
    }
    *(size_t *)(gbc.update_curbyte + 8) = (unit->data_size - 1) - (ulong)(byte)gbc.update_curbyte[2]
    ;
  }
  else {
    _in_spatial_layer = 0;
    end_pos = mpp_av1_read_leb128((BitReadCtx_t *)&start_pos,(RK_U64 *)&in_spatial_layer);
    if (end_pos < MPP_OK) {
      return end_pos;
    }
    *(RK_U64 *)(gbc.update_curbyte + 8) = _in_spatial_layer;
  }
  hdr_start_pos = mpp_get_bits_count((BitReadCtx_t *)&start_pos);
  if (ctx->fist_tile_group == 0) {
    ctx->frame_tag_size = ((hdr_start_pos - (int)obu_size) + 7 >> 3) + ctx->frame_tag_size;
  }
  if ((((gbc.update_curbyte[2] != (_func_MPP_RET_bitread_ctx_t_ptr)0x0) &&
       (gbc.update_curbyte[1] != (_func_MPP_RET_bitread_ctx_t_ptr)0x1)) &&
      (gbc.update_curbyte[1] != (_func_MPP_RET_bitread_ctx_t_ptr)0x2)) &&
     ((ctx->operating_point_idc != 0 &&
      (((ctx->operating_point_idc >> ((byte)ctx->temporal_id & 0x1f) & 1U) == 0 ||
       ((ctx->operating_point_idc >> ((char)ctx->spatial_id + 8U & 0x1f) & 1U) == 0)))))) {
    return MPP_ERR_PROTOL;
  }
  if ((av1d_debug & 2) != 0) {
    _mpp_log_l(4,"av1d_cbs","obu type %d size %d\n","mpp_av1_read_unit",
               (ulong)(byte)gbc.update_curbyte[1],*(undefined8 *)(gbc.update_curbyte + 8));
  }
  switch(gbc.update_curbyte[1]) {
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x1:
    end_pos = mpp_av1_sequence_header_obu
                        (ctx,(BitReadCtx_t *)&start_pos,
                         (AV1RawSequenceHeader *)(gbc.update_curbyte + 0x10));
    if (end_pos < MPP_OK) {
      return end_pos;
    }
    ctx->frame_tag_size = ctx->frame_tag_size + (int)*(undefined8 *)(gbc.update_curbyte + 8);
    if (-1 < ctx->operating_point) {
      if ((int)(uint)(byte)gbc.update_curbyte[0x16] < ctx->operating_point) {
        _mpp_log_l(2,"av1d_cbs",
                   "Invalid Operating Point %d requested. Must not be higher than %u.\n",(char *)0x0
                   ,(ulong)(uint)ctx->operating_point,(ulong)(byte)gbc.update_curbyte[0x16]);
        return MPP_ERR_PROTOL;
      }
      ctx->operating_point_idc =
           (uint)*(ushort *)(gbc.update_curbyte + (long)ctx->operating_point * 2 + 0x34);
    }
    ctx->sequence_header = (AV1RawSequenceHeader *)0x0;
    ctx->sequence_header = (AV1RawSequenceHeader *)(gbc.update_curbyte + 0x10);
    goto LAB_0020fba8;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x2:
    end_pos = mpp_av1_temporal_delimiter_obu(ctx,(BitReadCtx_t *)&start_pos);
    break;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x3:
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x7:
    end_pos = mpp_av1_frame_header_obu
                        (ctx,(BitReadCtx_t *)&start_pos,
                         (AV1RawFrameHeader *)(gbc.update_curbyte + 0x10),
                         (uint)(gbc.update_curbyte[1] == (_func_MPP_RET_bitread_ctx_t_ptr)0x7),
                         (void *)0x0);
    if (end_pos < MPP_OK) {
      return end_pos;
    }
    ctx->frame_tag_size = ctx->frame_tag_size + (int)*(undefined8 *)(gbc.update_curbyte + 8);
    goto LAB_0020fba8;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x4:
    RVar1 = mpp_get_bits_count((BitReadCtx_t *)&start_pos);
    end_pos = mpp_av1_tile_group_obu
                        (ctx,(BitReadCtx_t *)&start_pos,
                         (AV1RawTileGroup *)(gbc.update_curbyte + 0x10));
    if (end_pos < MPP_OK) {
      return end_pos;
    }
    if (ctx->fist_tile_group == 0) {
      RVar2 = mpp_get_bits_count((BitReadCtx_t *)&start_pos);
      ctx->frame_tag_size = ((RVar2 - RVar1) + 7U >> 3) + ctx->frame_tag_size;
    }
    ctx->fist_tile_group = 1;
    end_pos = mpp_av1_ref_tile_data
                        (unit,(BitReadCtx_t *)&start_pos,
                         (AV1RawTileData *)(gbc.update_curbyte + 0x18));
    break;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x5:
    ctx->frame_tag_size = ctx->frame_tag_size + (int)*(undefined8 *)(gbc.update_curbyte + 8);
    end_pos = mpp_av1_metadata_obu
                        (ctx,(BitReadCtx_t *)&start_pos,
                         (AV1RawMetadata *)(gbc.update_curbyte + 0x10));
    break;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x6:
    end_pos = mpp_av1_frame_obu(ctx,(BitReadCtx_t *)&start_pos,
                                (AV1RawFrame *)(gbc.update_curbyte + 0x10),(void *)0x0);
    if (end_pos < MPP_OK) {
      return end_pos;
    }
    end_pos = mpp_av1_ref_tile_data
                        (unit,(BitReadCtx_t *)&start_pos,
                         (AV1RawTileData *)(gbc.update_curbyte + 0x430));
    break;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0x8:
    end_pos = mpp_av1_tile_list_obu
                        (ctx,(BitReadCtx_t *)&start_pos,
                         (AV1RawTileList *)(gbc.update_curbyte + 0x10));
    if (end_pos < MPP_OK) {
      return end_pos;
    }
    end_pos = mpp_av1_ref_tile_data
                        (unit,(BitReadCtx_t *)&start_pos,
                         (AV1RawTileData *)(gbc.update_curbyte + 0x18));
    break;
  default:
    return MPP_ERR_VALUE;
  case (_func_MPP_RET_bitread_ctx_t_ptr)0xf:
    end_pos = mpp_av1_padding_obu(ctx,(BitReadCtx_t *)&start_pos,
                                  (AV1RawPadding *)(gbc.update_curbyte + 0x10));
  }
  if (end_pos < MPP_OK) {
    return end_pos;
  }
LAB_0020fba8:
  obu_size._4_4_ = mpp_get_bits_count((BitReadCtx_t *)&start_pos);
  if (((int)(unit->data_size << 3) < obu_size._4_4_) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "end_pos <= (RK_S32)(unit->data_size * 8)","mpp_av1_read_unit",0xb95),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((((*(long *)(gbc.update_curbyte + 8) != 0) &&
       (gbc.update_curbyte[1] != (_func_MPP_RET_bitread_ctx_t_ptr)0x4)) &&
      (gbc.update_curbyte[1] != (_func_MPP_RET_bitread_ctx_t_ptr)0x8)) &&
     (gbc.update_curbyte[1] != (_func_MPP_RET_bitread_ctx_t_ptr)0x6)) {
    nb_bits_00 = ((int)(*(long *)(gbc.update_curbyte + 8) << 3) + hdr_start_pos) - obu_size._4_4_;
    if (nb_bits_00 < 1) {
      return MPP_NOK;
    }
    MVar3 = mpp_av1_trailing_bits(ctx,(BitReadCtx_t *)&start_pos,nb_bits_00);
    if (MVar3 < MPP_OK) {
      return MVar3;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_av1_read_unit(AV1Context *ctx, Av1ObuUnit *unit)
{
    AV1RawOBU *obu;
    BitReadCtx_t gbc;
    RK_S32 err = 0, start_pos, end_pos, hdr_start_pos;

    err = mpp_av1_alloc_unit_content(unit);

    if (err < 0)
        return err;

    obu = unit->content;

    mpp_set_bitread_ctx(&gbc, unit->data, unit->data_size);

    hdr_start_pos = mpp_get_bits_count(&gbc);

    err = mpp_av1_read_obu_header(ctx, &gbc, &obu->header);
    if (err < 0)
        return err;
    mpp_assert(obu->header.obu_type == unit->type);

    if (obu->header.obu_has_size_field) {
        RK_U64 obu_size = 0;
        err = mpp_av1_read_leb128(&gbc, &obu_size);
        if (err < 0)
            return err;
        obu->obu_size = obu_size;
    } else {
        if (unit->data_size < (RK_U32)(1 + obu->header.obu_extension_flag)) {
            mpp_err( "Invalid OBU length: "
                     "unit too short (%d).\n", unit->data_size);
            return MPP_NOK;
        }
        obu->obu_size = unit->data_size - 1 - obu->header.obu_extension_flag;
    }

    start_pos = mpp_get_bits_count(&gbc);
    if (!ctx->fist_tile_group)
        ctx->frame_tag_size += ((start_pos - hdr_start_pos + 7) >> 3);
    if (obu->header.obu_extension_flag) {
        if (obu->header.obu_type != AV1_OBU_SEQUENCE_HEADER &&
            obu->header.obu_type != AV1_OBU_TEMPORAL_DELIMITER &&
            ctx->operating_point_idc) {
            RK_S32 in_temporal_layer =
                (ctx->operating_point_idc >>  ctx->temporal_id    ) & 1;
            RK_S32 in_spatial_layer  =
                (ctx->operating_point_idc >> (ctx->spatial_id + 8)) & 1;
            if (!in_temporal_layer || !in_spatial_layer) {
                return MPP_ERR_PROTOL; // drop_obu()
            }
        }
    }
    av1d_dbg(AV1D_DBG_HEADER, "obu type %d size %d\n",
             obu->header.obu_type, obu->obu_size);
    switch (obu->header.obu_type) {
    case AV1_OBU_SEQUENCE_HEADER: {
        err = mpp_av1_sequence_header_obu(ctx, &gbc,
                                          &obu->obu.sequence_header);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
        if (ctx->operating_point >= 0) {
            AV1RawSequenceHeader *sequence_header = &obu->obu.sequence_header;

            if (ctx->operating_point > sequence_header->operating_points_cnt_minus_1) {
                mpp_err("Invalid Operating Point %d requested. "
                        "Must not be higher than %u.\n",
                        ctx->operating_point, sequence_header->operating_points_cnt_minus_1);
                return MPP_ERR_PROTOL;
            }
            ctx->operating_point_idc = sequence_header->operating_point_idc[ctx->operating_point];
        }

        ctx->sequence_header = NULL;
        ctx->sequence_header = &obu->obu.sequence_header;
    } break;
    case AV1_OBU_TEMPORAL_DELIMITER: {
        err = mpp_av1_temporal_delimiter_obu(ctx, &gbc);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME_HEADER:
    case AV1_OBU_REDUNDANT_FRAME_HEADER: {
        err = mpp_av1_frame_header_obu(ctx, &gbc,
                                       &obu->obu.frame_header,
                                       obu->header.obu_type ==
                                       AV1_OBU_REDUNDANT_FRAME_HEADER,
                                       NULL);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
    } break;
    case AV1_OBU_TILE_GROUP: {
        RK_U32 cur_pos = mpp_get_bits_count(&gbc);

        err = mpp_av1_tile_group_obu(ctx, &gbc, &obu->obu.tile_group);
        if (err < 0)
            return err;
        if (!ctx->fist_tile_group)
            ctx->frame_tag_size += MPP_ALIGN(mpp_get_bits_count(&gbc) - cur_pos, 8) / 8;
        ctx->fist_tile_group = 1;
        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME: {
        err = mpp_av1_frame_obu(ctx, &gbc, &obu->obu.frame,
                                NULL);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.frame.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_TILE_LIST: {
        err = mpp_av1_tile_list_obu(ctx, &gbc, &obu->obu.tile_list);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_list.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_METADATA: {
        ctx->frame_tag_size += obu->obu_size;
        err = mpp_av1_metadata_obu(ctx, &gbc, &obu->obu.metadata);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_PADDING: {
        err = mpp_av1_padding_obu(ctx, &gbc, &obu->obu.padding);
        if (err < 0)
            return err;
    } break;
    default:
        return MPP_ERR_VALUE;
    }

    end_pos = mpp_get_bits_count(&gbc);
    mpp_assert(end_pos <= (RK_S32)(unit->data_size * 8));

    if (obu->obu_size > 0 &&
        obu->header.obu_type != AV1_OBU_TILE_GROUP &&
        obu->header.obu_type != AV1_OBU_TILE_LIST &&
        obu->header.obu_type != AV1_OBU_FRAME) {
        RK_S32 nb_bits = obu->obu_size * 8 + start_pos - end_pos;

        if (nb_bits <= 0)
            return MPP_NOK;

        err = mpp_av1_trailing_bits(ctx, &gbc, nb_bits);
        if (err < 0)
            return err;
    }

    return 0;
}